

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O2

Roaring * __thiscall doublechecked::Roaring::operator|=(Roaring *this,Roaring *r)

{
  roaring::Roaring::operator|=(&this->plain,&r->plain);
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<unsigned_int>>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&this->check,(r->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<unsigned_int>)&(r->check)._M_t._M_impl.super__Rb_tree_header);
  return this;
}

Assistant:

Roaring &operator|=(const Roaring &r) {
        plain |= r.plain;

        check.insert(r.check.begin(), r.check.end());  // won't add duplicates

        return *this;
    }